

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.h
# Opt level: O0

void __thiscall
cfd::core::AdaptorSignature::AdaptorSignature(AdaptorSignature *this,AdaptorSignature *param_1)

{
  AdaptorSignature *param_1_local;
  AdaptorSignature *this_local;
  
  ByteData::ByteData(&this->data_,&param_1->data_);
  return;
}

Assistant:

class CFD_CORE_EXPORT AdaptorSignature {
 public:
  /**
   * @brief Size of an adaptor signature.
   *
   */
  static constexpr uint32_t kAdaptorSignatureSize = 65;
  /**
   * @brief Construct a new Adaptor Signature object from ByteData
   *
   * @param data the data representing the adaptor signature
   */
  explicit AdaptorSignature(const ByteData &data);
  /**
   * @brief Construct a new Adaptor Signature object from a string
   *
   * @param data the data representing the adaptor signature
   */
  explicit AdaptorSignature(const std::string &data);

  /**
   * @brief Get the underlying ByteData object
   *
   * @return ByteData
   */
  ByteData GetData() const;

 private:
  /**
   * @brief The underlying data
   *
   */
  ByteData data_;
}